

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall Parser::FinishBackgroundRegExpNodes(Parser *this)

{
  RegexPattern *pRVar1;
  code *pcVar2;
  ParseNodePtr *ppPVar3;
  bool bVar4;
  undefined4 *puVar5;
  DList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *pDVar6;
  DListNodeBase<ParseNode_*> *pDVar7;
  ParseNodeRegExp *pPVar8;
  ParseNode **ppPVar9;
  ParseNodePtr *pnode_1;
  Iterator __iter_3;
  ParseNodePtr *pnodeBgnd;
  Iterator __iter_2;
  bool quit;
  ParseNodePtr *pnodeFgnd;
  Iterator __iter_1;
  ParseNodePtr *pnode;
  Iterator __iter;
  BackgroundParseItem *currBackgroundItem;
  Parser *this_local;
  
  bVar4 = IsBackgroundParser(this);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b0,"(!this->IsBackgroundParser())","!this->IsBackgroundParser()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (this->fastScannedRegExpNodes == (NodeDList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b1,"(this->fastScannedRegExpNodes)","this->fastScannedRegExpNodes");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (this->backgroundParseItems == (BackgroundParseItem *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b2,"(this->backgroundParseItems != nullptr)",
                       "this->backgroundParseItems != nullptr");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  for (__iter.current = (NodeBase *)this->backgroundParseItems; __iter.current != (NodeBase *)0x0;
      __iter.current =
           (NodeBase *)BackgroundParseItem::GetNext((BackgroundParseItem *)__iter.current)) {
    pDVar6 = BackgroundParseItem::RegExpNodeList((BackgroundParseItem *)__iter.current);
    if (pDVar6 != (DList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      pDVar6 = BackgroundParseItem::RegExpNodeList((BackgroundParseItem *)__iter.current);
      DListBase<ParseNode_*,_RealCount>::Iterator::Iterator
                ((Iterator *)&pnode,&pDVar6->super_DListBase<ParseNode_*,_RealCount>);
      while( true ) {
        if (__iter.list == (DListBase<ParseNode_*,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        ppPVar3 = pnode;
        pDVar7 = DListNodeBase<ParseNode_*>::Next(&(__iter.list)->super_DListNodeBase<ParseNode_*>);
        bVar4 = DListBase<ParseNode_*,_RealCount>::IsHead
                          ((DListBase<ParseNode_*,_RealCount> *)ppPVar3,pDVar7);
        if (bVar4) break;
        __iter.list = (DListBase<ParseNode_*,_RealCount> *)
                      DListNodeBase<ParseNode_*>::Next
                                (&(__iter.list)->super_DListNodeBase<ParseNode_*>);
        __iter_1.current =
             (NodeBase *)DListBase<ParseNode_*,_RealCount>::Iterator::Data((Iterator *)&pnode);
        pPVar8 = ParseNode::AsParseNodeRegExp((ParseNode *)((__iter_1.current)->next).base);
        if (pPVar8->regexPattern != (RegexPattern *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                             ,0x2bf,"(pnode->AsParseNodeRegExp()->regexPattern == nullptr)",
                             "pnode->AsParseNodeRegExp()->regexPattern == nullptr");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
      __iter.list = (DListBase<ParseNode_*,_RealCount> *)0x0;
    }
  }
  __iter.current = (NodeBase *)this->backgroundParseItems;
  DListBase<ParseNode_*,_RealCount>::Iterator::Iterator
            ((Iterator *)&pnodeFgnd,
             &this->fastScannedRegExpNodes->super_DListBase<ParseNode_*,_RealCount>);
  do {
    if (__iter_1.list == (DListBase<ParseNode_*,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    ppPVar3 = pnodeFgnd;
    pDVar7 = DListNodeBase<ParseNode_*>::Next(&(__iter_1.list)->super_DListNodeBase<ParseNode_*>);
    bVar4 = DListBase<ParseNode_*,_RealCount>::IsHead
                      ((DListBase<ParseNode_*,_RealCount> *)ppPVar3,pDVar7);
    if (bVar4) {
      __iter_1.list = (DListBase<ParseNode_*,_RealCount> *)0x0;
      __iter.current = (NodeBase *)this->backgroundParseItems;
      do {
        if (__iter.current == (NodeBase *)0x0) {
          return;
        }
        pDVar6 = BackgroundParseItem::RegExpNodeList((BackgroundParseItem *)__iter.current);
        if (pDVar6 != (DList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          pDVar6 = BackgroundParseItem::RegExpNodeList((BackgroundParseItem *)__iter.current);
          DListBase<ParseNode_*,_RealCount>::Iterator::Iterator
                    ((Iterator *)&pnode_1,&pDVar6->super_DListBase<ParseNode_*,_RealCount>);
          while( true ) {
            if (__iter_3.list == (DListBase<ParseNode_*,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                                 ,0x66,"(current != nullptr)","current != nullptr");
              if (!bVar4) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
            ppPVar3 = pnode_1;
            pDVar7 = DListNodeBase<ParseNode_*>::Next
                               (&(__iter_3.list)->super_DListNodeBase<ParseNode_*>);
            bVar4 = DListBase<ParseNode_*,_RealCount>::IsHead
                              ((DListBase<ParseNode_*,_RealCount> *)ppPVar3,pDVar7);
            if (bVar4) break;
            __iter_3.list =
                 (DListBase<ParseNode_*,_RealCount> *)
                 DListNodeBase<ParseNode_*>::Next
                           (&(__iter_3.list)->super_DListNodeBase<ParseNode_*>);
            ppPVar9 = DListBase<ParseNode_*,_RealCount>::Iterator::Data((Iterator *)&pnode_1);
            pPVar8 = ParseNode::AsParseNodeRegExp(*ppPVar9);
            if (pPVar8->regexPattern == (RegexPattern *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                 ,0x306,"(pnode->AsParseNodeRegExp()->regexPattern != nullptr)",
                                 "pnode->AsParseNodeRegExp()->regexPattern != nullptr");
              if (!bVar4) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
          }
          __iter_3.list = (DListBase<ParseNode_*,_RealCount> *)0x0;
        }
        __iter.current =
             (NodeBase *)BackgroundParseItem::GetNext((BackgroundParseItem *)__iter.current);
      } while( true );
    }
    __iter_1.list =
         (DListBase<ParseNode_*,_RealCount> *)
         DListNodeBase<ParseNode_*>::Next(&(__iter_1.list)->super_DListNodeBase<ParseNode_*>);
    ppPVar9 = DListBase<ParseNode_*,_RealCount>::Iterator::Data((Iterator *)&pnodeFgnd);
    if ((*ppPVar9)->nop != knopRegExp) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x2d0,"(pnodeFgnd->nop == knopRegExp)","pnodeFgnd->nop == knopRegExp");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pPVar8 = ParseNode::AsParseNodeRegExp(*ppPVar9);
    if (pPVar8->regexPattern == (RegexPattern *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x2d1,"(pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr)",
                         "pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    __iter_2.current._7_1_ = 0;
    while (((__iter_2.current._7_1_ ^ 0xff) & 1) != 0) {
      while( true ) {
        bVar4 = false;
        if (__iter.current != (NodeBase *)0x0) {
          pDVar6 = BackgroundParseItem::RegExpNodeList((BackgroundParseItem *)__iter.current);
          bVar4 = pDVar6 == (DList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
        }
        if (!bVar4) break;
        __iter.current =
             (NodeBase *)BackgroundParseItem::GetNext((BackgroundParseItem *)__iter.current);
      }
      if (__iter.current == (NodeBase *)0x0) break;
      pDVar6 = BackgroundParseItem::RegExpNodeList((BackgroundParseItem *)__iter.current);
      DListBase<ParseNode_*,_RealCount>::Iterator::Iterator
                ((Iterator *)&pnodeBgnd,&pDVar6->super_DListBase<ParseNode_*,_RealCount>);
      do {
        if (__iter_2.list == (DListBase<ParseNode_*,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        ppPVar3 = pnodeBgnd;
        pDVar7 = DListNodeBase<ParseNode_*>::Next
                           (&(__iter_2.list)->super_DListNodeBase<ParseNode_*>);
        bVar4 = DListBase<ParseNode_*,_RealCount>::IsHead
                          ((DListBase<ParseNode_*,_RealCount> *)ppPVar3,pDVar7);
        if (bVar4) {
          __iter_2.list = (DListBase<ParseNode_*,_RealCount> *)0x0;
          goto LAB_0151ebf9;
        }
        __iter_2.list =
             (DListBase<ParseNode_*,_RealCount> *)
             DListNodeBase<ParseNode_*>::Next(&(__iter_2.list)->super_DListNodeBase<ParseNode_*>);
        __iter_3.current =
             (NodeBase *)DListBase<ParseNode_*,_RealCount>::Iterator::Data((Iterator *)&pnodeBgnd);
        if (((ParseNode *)((__iter_3.current)->next).base)->nop != knopRegExp) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                             ,0x2e3,"(pnodeBgnd->nop == knopRegExp)","pnodeBgnd->nop == knopRegExp")
          ;
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      } while (*(uint *)((long)&(((__iter_3.current)->next).base)->next + 4) < (*ppPVar9)->ichMin);
      if ((*ppPVar9)->ichMin == *(charcount_t *)((long)&(((__iter_3.current)->next).base)->next + 4)
         ) {
        if ((*ppPVar9)->ichLim != *(charcount_t *)&(((__iter_3.current)->next).base)->prev) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                             ,0x2eb,"(pnodeFgnd->ichLim == pnodeBgnd->ichLim)",
                             "pnodeFgnd->ichLim == pnodeBgnd->ichLim");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        pPVar8 = ParseNode::AsParseNodeRegExp(*ppPVar9);
        pRVar1 = pPVar8->regexPattern;
        pPVar8 = ParseNode::AsParseNodeRegExp((ParseNode *)((__iter_3.current)->next).base);
        pPVar8->regexPattern = pRVar1;
      }
      __iter_2.current._7_1_ = 1;
LAB_0151ebf9:
      if ((__iter_2.current._7_1_ & 1) == 0) {
        __iter.current =
             (NodeBase *)BackgroundParseItem::GetNext((BackgroundParseItem *)__iter.current);
      }
    }
  } while( true );
}

Assistant:

void Parser::FinishBackgroundRegExpNodes()
{
    // We have a list of RegExp nodes that we saw on the UI thread in functions we're parallel parsing,
    // and for each background job we have a list of RegExp nodes for which we couldn't allocate patterns.
    // We need to copy the pattern pointers from the UI thread nodes to the corresponding nodes on the
    // background nodes.
    // There may be UI thread nodes for which there are no background thread equivalents, because the UI thread
    // has to assume that the background thread won't defer anything.

    // Note that because these lists (and the list of background jobs) are SList's built by prepending, they are
    // all in reverse lexical order.

    Assert(!this->IsBackgroundParser());
    Assert(this->fastScannedRegExpNodes);
    Assert(this->backgroundParseItems != nullptr);

    BackgroundParseItem *currBackgroundItem;

#if DBG
    for (currBackgroundItem = this->backgroundParseItems;
        currBackgroundItem;
        currBackgroundItem = currBackgroundItem->GetNext())
    {
        if (currBackgroundItem->RegExpNodeList())
        {
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnode, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnode->AsParseNodeRegExp()->regexPattern == nullptr);
            }
            NEXT_DLIST_ENTRY;
        }
    }
#endif

    // Hook up the patterns allocated on the main thread to the nodes created on the background thread.
    // Walk the list of foreground nodes, advancing through the work items and looking up each item.
    // Note that the background thread may have chosen to defer a given RegEx literal, so not every foreground
    // node will have a matching background node. Doesn't matter for correctness.
    // (It's inefficient, of course, to have to restart the inner loop from the beginning of the work item's
    // list, but it should be unusual to have many RegExes in a single work item's chunk of code. Figure out how
    // to start the inner loop from a known internal node within the list if that turns out to be important.)
    currBackgroundItem = this->backgroundParseItems;
    FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnodeFgnd, this->fastScannedRegExpNodes)
    {
        Assert(pnodeFgnd->nop == knopRegExp);
        Assert(pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr);
        bool quit = false;

        while (!quit)
        {
            // Find the next work item with a RegEx in it.
            while (currBackgroundItem && currBackgroundItem->RegExpNodeList() == nullptr)
            {
                currBackgroundItem = currBackgroundItem->GetNext();
            }
            if (!currBackgroundItem)
            {
                break;
            }

            // Walk the RegExps in the work item.
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnodeBgnd, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnodeBgnd->nop == knopRegExp);

                if (pnodeFgnd->ichMin <= pnodeBgnd->ichMin)
                {
                    // Either we found a match, or the next background node is past the foreground node.
                    // In any case, we can stop searching.
                    if (pnodeFgnd->ichMin == pnodeBgnd->ichMin)
                    {
                        Assert(pnodeFgnd->ichLim == pnodeBgnd->ichLim);
                        pnodeBgnd->AsParseNodeRegExp()->regexPattern = pnodeFgnd->AsParseNodeRegExp()->regexPattern;
                    }
                    quit = true;
                    break;
                }
            }
            NEXT_DLIST_ENTRY;

            if (!quit)
            {
                // Need to advance to the next work item.
                currBackgroundItem = currBackgroundItem->GetNext();
            }
        }
    }
    NEXT_DLIST_ENTRY;

#if DBG
    for (currBackgroundItem = this->backgroundParseItems;
        currBackgroundItem;
        currBackgroundItem = currBackgroundItem->GetNext())
    {
        if (currBackgroundItem->RegExpNodeList())
        {
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnode, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnode->AsParseNodeRegExp()->regexPattern != nullptr);
            }
            NEXT_DLIST_ENTRY;
        }
    }
#endif
}